

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::FontTests::__FontProvidesItsAccessorDescriptor_meta(char **name)

{
  char **name_local;
  
  *name = "FontProvidesItsAccessorDescriptor";
  return (offset_in_this_suite_class_to_subr)FontProvidesItsAccessorDescriptor;
}

Assistant:

test( FontProvidesItsAccessorDescriptor )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = {
					{ L'a', 19 }, { L'B', 13111 },
				};
				mocks::font_accessor::glyph glyphs[] = { { { 0, 0 } }, };
				shared_ptr<mocks::font_accessor> a(new mocks::font_accessor(c_fm1, indices, glyphs));

				a->descriptor = font_descriptor::create("Tahoma", 10, bold, false, hint_strong);

				// INIT / ACT
				font f(a);

				// ACT / ASSERT
				assert_equal(a->descriptor, f.get_key());

				// INIT
				a->descriptor = font_descriptor::create("Verdana", 13, regular, true, hint_none);

				// ACT / ASSERT
				assert_equal(a->descriptor, f.get_key());
			}